

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

RPCErrorCode RPCErrorFromPSBTError(PSBTError err)

{
  RPCErrorCode RVar1;
  long in_FS_OFFSET;
  
  RVar1 = RPC_INVALID_PARAMETER;
  if (err != UNSUPPORTED) {
    RVar1 = (uint)(err == SIGHASH_MISMATCH) * 3 + RPC_TRANSACTION_ERROR;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return RVar1;
  }
  __stack_chk_fail();
}

Assistant:

RPCErrorCode RPCErrorFromPSBTError(PSBTError err)
{
    switch (err) {
        case PSBTError::UNSUPPORTED:
            return RPC_INVALID_PARAMETER;
        case PSBTError::SIGHASH_MISMATCH:
            return RPC_DESERIALIZATION_ERROR;
        default: break;
    }
    return RPC_TRANSACTION_ERROR;
}